

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomControlPdu.cpp
# Opt level: O1

bool __thiscall
DIS::IntercomControlPdu::operator==(IntercomControlPdu *this,IntercomControlPdu *rhs)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  pointer pIVar18;
  long lVar19;
  ulong uVar20;
  
  bVar15 = RadioCommunicationsFamilyPdu::operator==
                     (&this->super_RadioCommunicationsFamilyPdu,
                      &rhs->super_RadioCommunicationsFamilyPdu);
  cVar1 = (this->super_RadioCommunicationsFamilyPdu).field_0x2a;
  cVar2 = (rhs->super_RadioCommunicationsFamilyPdu).field_0x2a;
  cVar3 = (rhs->super_RadioCommunicationsFamilyPdu).field_0x2b;
  cVar4 = (this->super_RadioCommunicationsFamilyPdu).field_0x2b;
  bVar16 = EntityID::operator==(&this->_sourceEntityID,&rhs->_sourceEntityID);
  uVar5 = this->_sourceCommunicationsDeviceID;
  uVar6 = rhs->_sourceCommunicationsDeviceID;
  uVar7 = rhs->_sourceLineID;
  uVar8 = this->_sourceLineID;
  uVar9 = rhs->_transmitPriority;
  uVar10 = this->_transmitPriority;
  uVar11 = rhs->_transmitLineState;
  uVar12 = this->_transmitLineState;
  uVar13 = rhs->_command;
  uVar14 = this->_command;
  bVar17 = EntityID::operator==(&this->_masterEntityID,&rhs->_masterEntityID);
  bVar15 = (((uVar8 == uVar7 && (uVar5 == uVar6 && bVar16)) && cVar4 == cVar3) &&
           ((uVar12 == uVar11 && uVar10 == uVar9) &&
           ((this->_masterCommunicationsDeviceID == rhs->_masterCommunicationsDeviceID && bVar17) &&
           uVar14 == uVar13))) && (cVar1 == cVar2 && bVar15);
  pIVar18 = (this->_intercomParameters).
            super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_intercomParameters).
      super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar18) {
    lVar19 = 0;
    uVar20 = 0;
    do {
      bVar16 = IntercomCommunicationsParameters::operator==
                         ((IntercomCommunicationsParameters *)
                          ((long)&pIVar18->_vptr_IntercomCommunicationsParameters + lVar19),
                          (IntercomCommunicationsParameters *)
                          ((long)&((rhs->_intercomParameters).
                                   super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                  _vptr_IntercomCommunicationsParameters + lVar19));
      if (!bVar16) {
        bVar15 = false;
      }
      uVar20 = uVar20 + 1;
      pIVar18 = (this->_intercomParameters).
                super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar19 = lVar19 + 0x10;
    } while (uVar20 < (ulong)((long)(this->_intercomParameters).
                                    super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar18 >> 4)
            );
  }
  return bVar15;
}

Assistant:

bool IntercomControlPdu::operator ==(const IntercomControlPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = RadioCommunicationsFamilyPdu::operator==(rhs);

     if( ! (_controlType == rhs._controlType) ) ivarsEqual = false;
     if( ! (_communicationsChannelType == rhs._communicationsChannelType) ) ivarsEqual = false;
     if( ! (_sourceEntityID == rhs._sourceEntityID) ) ivarsEqual = false;
     if( ! (_sourceCommunicationsDeviceID == rhs._sourceCommunicationsDeviceID) ) ivarsEqual = false;
     if( ! (_sourceLineID == rhs._sourceLineID) ) ivarsEqual = false;
     if( ! (_transmitPriority == rhs._transmitPriority) ) ivarsEqual = false;
     if( ! (_transmitLineState == rhs._transmitLineState) ) ivarsEqual = false;
     if( ! (_command == rhs._command) ) ivarsEqual = false;
     if( ! (_masterEntityID == rhs._masterEntityID) ) ivarsEqual = false;
     if( ! (_masterCommunicationsDeviceID == rhs._masterCommunicationsDeviceID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _intercomParameters.size(); idx++)
     {
        if( ! ( _intercomParameters[idx] == rhs._intercomParameters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }